

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::Expression::bindMembershipExpressions
          (Expression *this,ASTContext *context,TokenKind keyword,bool requireIntegral,
          bool unwrapUnpacked,bool allowTypeReferences,bool allowOpenRange,
          ExpressionSyntax *valueExpr,
          span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions,
          SmallVectorBase<const_slang::ast::Expression_*> *results)

{
  Compilation *compilation;
  Type *bt;
  long lVar1;
  long lVar2;
  SyntaxNode *pSVar3;
  Expression *pEVar4;
  bool bVar5;
  SourceLocation this_00;
  Type *pTVar6;
  Diagnostic *pDVar7;
  undefined7 in_register_00000009;
  char *func;
  undefined6 in_register_00000012;
  long lVar8;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  bitmask<slang::ast::ASTFlags> extraFlags;
  ConstantValue *pCVar9;
  string_view sVar10;
  bool bad;
  bool canBeStrings;
  undefined7 in_stack_00000009;
  anon_class_48_6_7cdd41da checkType;
  bool local_94;
  bool local_93;
  TokenKind local_92;
  Expression *local_90;
  Type *local_88;
  undefined4 local_7c;
  ConstantValue *local_78;
  undefined4 local_6c;
  SourceLocation local_68;
  anon_class_48_6_7cdd41da local_60;
  
  local_78 = (ConstantValue *)
             CONCAT44(local_78._4_4_,CONCAT31(in_register_00000089,allowTypeReferences));
  local_6c = (undefined4)CONCAT71(in_register_00000009,requireIntegral);
  local_7c = (undefined4)CONCAT62(in_register_00000012,keyword);
  local_92 = (TokenKind)context;
  if (*(undefined8 **)this == (undefined8 *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
LAB_003a7453:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,func);
  }
  extraFlags.m_bits._0_4_ = (int)CONCAT71(in_register_00000081,unwrapUnpacked) << 0x11;
  extraFlags.m_bits._4_4_ = 0;
  compilation = (Compilation *)**(undefined8 **)this;
  this_00 = (SourceLocation)
            create(compilation,(ExpressionSyntax *)CONCAT71(in_stack_00000009,allowOpenRange),
                   (ASTContext *)this,extraFlags,(Type *)0x0);
  local_60.type = (Type **)this_00;
  SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
            ((SmallVectorBase<slang::ast::Expression_const*> *)expressions.size_,
             (Expression **)&local_60);
  pTVar6 = ((not_null<const_slang::ast::Type_*> *)((long)this_00 + 8))->ptr;
  if (pTVar6 == (Type *)0x0) {
LAB_003a743e:
    func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
    ;
    goto LAB_003a7453;
  }
  local_88 = pTVar6;
  local_94 = Expression::bad((Expression *)this_00);
  local_93 = isImplicitString((Expression *)this_00);
  if ((char)local_7c == '\0') {
    bVar5 = Type::isAggregate(local_88);
    if (!bVar5) {
      if ((char)local_7c == '\0') goto LAB_003a7111;
      goto LAB_003a70a4;
    }
  }
  else {
LAB_003a70a4:
    bVar5 = Type::isIntegral(local_88);
    if (bVar5) goto LAB_003a7111;
  }
  if (local_94 == false) {
    pDVar7 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x260007,
                                 *(SourceRange *)((long)this_00 + 0x20));
    pDVar7 = ast::operator<<(pDVar7,local_88);
    sVar10 = parsing::LexerFacts::getTokenKindText(local_92);
    Diagnostic::operator<<(pDVar7,sVar10);
    local_94 = true;
  }
LAB_003a7111:
  local_60.type = &local_88;
  local_60.canBeStrings = &local_93;
  local_60.keyword = &local_92;
  local_60.bad = &local_94;
  local_60.comp = compilation;
  local_60.context = (ASTContext *)this;
  if (expressions.data_ != (pointer)0x0) {
    pSVar3 = &valueExpr->super_SyntaxNode;
    local_68 = (SourceLocation)extraFlags.m_bits;
    do {
      local_90 = create(compilation,*(ExpressionSyntax **)valueExpr,(ASTContext *)this,extraFlags,
                        (Type *)0x0);
      SmallVectorBase<slang::ast::Expression_const*>::
      emplace_back<slang::ast::Expression_const*const&>
                ((SmallVectorBase<slang::ast::Expression_const*> *)expressions.size_,&local_90);
      bVar5 = Expression::bad(local_90);
      local_94 = (bool)(bVar5 | local_94);
      if (local_94 == false) {
        if (((char)local_78 == '\0') || (local_90->kind != OpenRange)) {
          pTVar6 = (local_90->type).ptr;
          if (pTVar6 == (Type *)0x0) goto LAB_003a743e;
          if ((char)local_7c == '\0') {
            if ((char)local_6c != '\0') {
              while (bVar5 = Type::isUnpackedArray(pTVar6), bVar5) {
                pTVar6 = Type::getArrayElementType(pTVar6);
              }
            }
            if ((local_93 == true) && (bVar5 = isImplicitString(local_90), !bVar5)) {
              if (pTVar6->canonical == (Type *)0x0) {
                Type::resolveCanonical(pTVar6);
              }
              if ((pTVar6->canonical->super_Symbol).kind != StringType) {
                local_93 = false;
              }
            }
            bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()
                      (&local_60,local_90,pTVar6);
          }
          else {
            bVar5 = Type::isIntegral(pTVar6);
            if (bVar5) {
              local_88 = binaryOperatorType(compilation,local_88,pTVar6,false,false);
            }
            else {
              pDVar7 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x260007,
                                           local_90->sourceRange);
              pDVar7 = ast::operator<<(pDVar7,pTVar6);
              sVar10 = parsing::LexerFacts::getTokenKindText(local_92);
              Diagnostic::operator<<(pDVar7,sVar10);
              local_94 = true;
            }
          }
        }
        else {
          if ((local_93 == true) && (bVar5 = isImplicitString(local_90), !bVar5)) {
            local_93 = false;
          }
          pEVar4 = local_90;
          if (local_90->kind != OpenRange) {
            assert::assertFailed
                      ("T::isKind(kind)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Expression.h"
                       ,0x125,
                       "T &slang::ast::Expression::as() [T = slang::ast::OpenRangeExpression]");
          }
          pTVar6 = ((*(Expression **)(local_90 + 1))->type).ptr;
          if (pTVar6 == (Type *)0x0) goto LAB_003a743e;
          bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()
                    (&local_60,*(Expression **)(local_90 + 1),pTVar6);
          pTVar6 = pEVar4[1].type.ptr;
          bt = (Type *)(pTVar6->super_Symbol).name._M_len;
          if (bt == (Type *)0x0) goto LAB_003a743e;
          bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()
                    (&local_60,(Expression *)pTVar6,bt);
          extraFlags.m_bits = (underlying_type)local_68;
        }
      }
      valueExpr = (ExpressionSyntax *)((long)valueExpr + 8);
    } while (valueExpr != (ExpressionSyntax *)(&pSVar3->parent + (long)expressions.data_));
  }
  if (local_94 == false) {
    lVar1 = *(long *)(expressions.size_ + 8);
    bVar5 = lVar1 == 0;
    if (!bVar5) {
      lVar2 = *(long *)expressions.size_;
      lVar8 = 0;
      pCVar9 = (ConstantValue *)0x0;
      do {
        local_90 = *(Expression **)(lVar2 + lVar8);
        bVar5 = Type::isNumeric(local_88);
        pTVar6 = local_88;
        if (bVar5) {
LAB_003a73b6:
          pTVar6 = (local_90->type).ptr;
          if (pTVar6 == (Type *)0x0) goto LAB_003a743e;
          bVar5 = Type::isUnpackedArray(pTVar6);
          if (bVar5) goto LAB_003a73cd;
          contextDetermined((ASTContext *)this,&local_90,local_88,(SourceLocation)0x0);
        }
        else {
          local_78 = pCVar9;
          if (local_88->canonical == (Type *)0x0) {
            Type::resolveCanonical(local_88);
          }
          pCVar9 = local_78;
          if ((pTVar6->canonical->super_Symbol).kind == StringType) goto LAB_003a73b6;
LAB_003a73cd:
          selfDetermined((ASTContext *)this,&local_90);
        }
        bVar5 = Expression::bad(local_90);
        if (!bVar5) {
          if (*(ConstantValue **)(expressions.size_ + 8) <= pCVar9) {
            assert::assertFailed
                      ("index < len",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                       ,0x196,
                       "reference slang::SmallVectorBase<const slang::ast::Expression *>::operator[](size_type) [T = const slang::ast::Expression *]"
                      );
          }
          *(Expression **)(*(long *)expressions.size_ + (long)pCVar9 * 8) = local_90;
          pCVar9 = (ConstantValue *)
                   ((long)&(pCVar9->value).
                           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   + 1);
        }
        if (bVar5) goto LAB_003a732d;
        lVar8 = lVar8 + 8;
        bVar5 = lVar1 << 3 == lVar8;
      } while (!bVar5);
    }
  }
  else {
LAB_003a732d:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Expression::bindMembershipExpressions(const ASTContext& context, TokenKind keyword,
                                           bool requireIntegral, bool unwrapUnpacked,
                                           bool allowTypeReferences, bool allowOpenRange,
                                           const ExpressionSyntax& valueExpr,
                                           span<const ExpressionSyntax* const> expressions,
                                           SmallVectorBase<const Expression*>& results) {
    auto extraFlags = allowTypeReferences ? ASTFlags::AllowTypeReferences : ASTFlags::None;
    Compilation& comp = context.getCompilation();
    Expression& valueRes = create(comp, valueExpr, context, extraFlags);
    results.push_back(&valueRes);

    const Type* type = valueRes.type;
    bool bad = valueRes.bad();
    bool canBeStrings = valueRes.isImplicitString();

    if ((!requireIntegral && type->isAggregate()) || (requireIntegral && !type->isIntegral())) {
        if (!bad) {
            context.addDiag(diag::BadSetMembershipType, valueRes.sourceRange)
                << *type << LexerFacts::getTokenKindText(keyword);
            bad = true;
        }
    }

    auto checkType = [&](const Expression& expr, const Type& bt) {
        if (bt.isNumeric() && type->isNumeric()) {
            type = binaryOperatorType(comp, type, &bt, false);
        }
        else if ((bt.isClass() && bt.isAssignmentCompatible(*type)) ||
                 (type->isClass() && type->isAssignmentCompatible(bt))) {
            // ok
        }
        else if ((bt.isCHandle() || bt.isNull()) && (type->isCHandle() || type->isNull())) {
            // ok
        }
        else if ((bt.isEvent() || bt.isNull()) && (type->isEvent() || type->isNull())) {
            // ok
        }
        else if ((bt.isCovergroup() || bt.isNull()) && (type->isCovergroup() || type->isNull())) {
            // ok
        }
        else if (bt.isTypeRefType() && type->isTypeRefType()) {
            // ok
        }
        else if (canBeStrings) {
            // If canBeStrings is still true, it means either this specific type or
            // the common type (or both) are of type string. This is ok, but force
            // all further expressions to also be strings (or implicitly
            // convertible to them).
            type = &comp.getStringType();
        }
        else if (bt.isAggregate()) {
            // Aggregates are just never allowed in membership expressions.
            context.addDiag(diag::BadSetMembershipType, expr.sourceRange)
                << bt << LexerFacts::getTokenKindText(keyword);
            bad = true;
        }
        else {
            // Couldn't find a common type.
            context.addDiag(diag::NoCommonComparisonType, expr.sourceRange)
                << LexerFacts::getTokenKindText(keyword) << bt << *type;
            bad = true;
        }
    };

    // We need to find a common type across all expressions. If this is for a wildcard
    // case statement, the types can only be integral. Otherwise all singular types are allowed.
    for (auto expr : expressions) {
        Expression* bound = &create(comp, *expr, context, extraFlags);
        results.push_back(bound);
        bad |= bound->bad();
        if (bad)
            continue;

        // Special handling for open range expressions -- they don't have
        // a real type on their own, we need to check their bounds.
        if (allowOpenRange && bound->kind == ExpressionKind::OpenRange) {
            if (canBeStrings && !bound->isImplicitString())
                canBeStrings = false;

            auto& range = bound->as<OpenRangeExpression>();
            checkType(range.left(), *range.left().type);
            checkType(range.right(), *range.right().type);
            continue;
        }

        const Type* bt = bound->type;
        if (requireIntegral) {
            if (!bt->isIntegral()) {
                context.addDiag(diag::BadSetMembershipType, bound->sourceRange)
                    << *bt << LexerFacts::getTokenKindText(keyword);
                bad = true;
            }
            else {
                type = binaryOperatorType(comp, type, bt, false);
            }
            continue;
        }

        // If this is an "inside" operation, then unpacked arrays are unwrapped
        // into their element types before checking further.
        if (unwrapUnpacked) {
            while (bt->isUnpackedArray())
                bt = bt->getArrayElementType();
        }

        if (canBeStrings && !bound->isImplicitString() && !bt->isString())
            canBeStrings = false;

        checkType(*bound, *bt);
    }

    if (bad)
        return false;

    size_t index = 0;
    for (auto result : results) {
        // const_casts here are because we want the result array to be constant and
        // don't want to waste time / space allocating another array here locally just
        // to immediately copy it to the output.
        Expression* expr = const_cast<Expression*>(result);

        if ((type->isNumeric() || type->isString()) && !expr->type->isUnpackedArray())
            contextDetermined(context, expr, *type);
        else
            selfDetermined(context, expr);

        if (expr->bad())
            return false;

        results[index++] = expr;
    }

    return true;
}